

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O0

void __thiscall CUIRect::HSplitBottom(CUIRect *this,float Cut,CUIRect *pTop,CUIRect *pBottom)

{
  long lVar1;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  CUIRect r;
  undefined4 local_18;
  float fStack_14;
  undefined4 local_10;
  float fStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (undefined4)*in_RDI;
  fStack_14 = (float)((ulong)*in_RDI >> 0x20);
  local_10 = (undefined4)in_RDI[1];
  fStack_c = (float)((ulong)in_RDI[1] >> 0x20);
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = local_18;
    in_RSI[1] = fStack_14;
    in_RSI[2] = local_10;
    in_RSI[3] = fStack_c - in_XMM0_Da;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = local_18;
    in_RDX[1] = (fStack_14 + fStack_c) - in_XMM0_Da;
    in_RDX[2] = local_10;
    in_RDX[3] = in_XMM0_Da;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUIRect::HSplitBottom(float Cut, CUIRect *pTop, CUIRect *pBottom) const
{
	CUIRect r = *this;

	if(pTop)
	{
		pTop->x = r.x;
		pTop->y = r.y;
		pTop->w = r.w;
		pTop->h = r.h - Cut;
	}

	if(pBottom)
	{
		pBottom->x = r.x;
		pBottom->y = r.y + r.h - Cut;
		pBottom->w = r.w;
		pBottom->h = Cut;
	}
}